

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O0

char * __thiscall SMBusAnalyzerSettings::SaveSettings(SMBusAnalyzerSettings *this)

{
  byte bVar1;
  char *pcVar2;
  SimpleArchive local_18 [8];
  SimpleArchive text_archive;
  SMBusAnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive(local_18);
  SimpleArchive::operator<<(local_18,&this->mSMBDAT);
  SimpleArchive::operator<<(local_18,&this->mSMBCLK);
  SimpleArchive::operator<<(local_18,this->mDecodeLevel);
  bVar1 = AnalyzerSettingInterfaceBool::GetValue();
  SimpleArchive::operator<<(local_18,(bool)(bVar1 & 1));
  SimpleArchive::GetString();
  pcVar2 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_18);
  return pcVar2;
}

Assistant:

const char* SMBusAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mSMBDAT;
    text_archive << mSMBCLK;
    text_archive << mDecodeLevel;
    text_archive << mCalculatePECInterface.GetValue();

    return SetReturnString( text_archive.GetString() );
}